

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeConditional(Ref condition,Ref ifTrue,Ref ifFalse)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  
  RVar1 = makeRawArray(4);
  r = makeRawString((IString *)&CONDITIONAL);
  pVVar2 = Value::push_back(RVar1.inst,r);
  pVVar2 = Value::push_back(pVVar2,condition);
  pVVar2 = Value::push_back(pVVar2,ifTrue);
  RVar1.inst = Value::push_back(pVVar2,ifFalse);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeConditional(Ref condition, Ref ifTrue, Ref ifFalse) {
    return &makeRawArray(4)
              ->push_back(makeRawString(CONDITIONAL))
              .push_back(condition)
              .push_back(ifTrue)
              .push_back(ifFalse);
  }